

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.h
# Opt level: O3

void __thiscall
llvm::MCSuperRegIterator::MCSuperRegIterator
          (MCSuperRegIterator *this,MCRegister Reg,MCRegisterInfo *MCRI,bool IncludeSelf)

{
  uint uVar1;
  MCPhysReg *pMVar2;
  MCRegister MVar3;
  
  (this->super_DiffListIterator).Val = 0;
  (this->super_DiffListIterator).List = (MCPhysReg *)0x0;
  if (Reg.Reg < MCRI->NumRegs) {
    uVar1 = MCRI->Desc[Reg.Reg].SuperRegs;
    pMVar2 = MCRI->DiffLists;
    (this->super_DiffListIterator).Val = (uint16_t)Reg.Reg;
    (this->super_DiffListIterator).List = pMVar2 + uVar1;
    if (!IncludeSelf) {
      MVar3 = MCRegisterInfo::DiffListIterator::advance(&this->super_DiffListIterator);
      if (MVar3.Reg == 0) {
        (this->super_DiffListIterator).List = (MCPhysReg *)0x0;
      }
    }
    return;
  }
  __assert_fail("RegNo < NumRegs && \"Attempting to access record for invalid register number!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/MC/MCRegisterInfo.h"
                ,0x14b,"const MCRegisterDesc &llvm::MCRegisterInfo::operator[](MCRegister) const");
}

Assistant:

MCSuperRegIterator(MCRegister Reg, const MCRegisterInfo *MCRI,
                     bool IncludeSelf = false) {
    init(Reg, MCRI->DiffLists + MCRI->get(Reg).SuperRegs);
    // Initially, the iterator points to Reg itself.
    if (!IncludeSelf)
      ++*this;
  }